

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

vector<AST_*,_std::allocator<AST_*>_> * __thiscall
AST::findNonRecursive
          (vector<AST_*,_std::allocator<AST_*>_> *__return_storage_ptr__,AST *this,string *varName)

{
  ASTree *this_00;
  bool bVar1;
  reference ppAVar2;
  AST *this_01;
  AST *local_98;
  ASTree *local_90;
  ASTree *tree;
  iterator __end1;
  iterator __begin1;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *__range1;
  string local_60;
  undefined1 local_39;
  undefined1 local_38 [8];
  vector<ASTree_*,_std::allocator<ASTree_*>_> trees1;
  string *varName_local;
  AST *this_local;
  vector<AST_*,_std::allocator<AST_*>_> *trees2;
  
  trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)varName;
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector
            ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_38);
  local_39 = 0;
  std::vector<AST_*,_std::allocator<AST_*>_>::vector(__return_storage_ptr__);
  this_00 = this->ast;
  std::__cxx11::string::string((string *)&local_60,(string *)varName);
  ASTree::findNonRecursive
            (this_00,&local_60,(vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_38);
  std::__cxx11::string::~string((string *)&local_60);
  __end1 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::begin
                     ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_38);
  tree = (ASTree *)
         std::vector<ASTree_*,_std::allocator<ASTree_*>_>::end
                   ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>
                                     *)&tree), bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
              operator*(&__end1);
    local_90 = *ppAVar2;
    this_01 = (AST *)operator_new(8);
    AST(this_01,local_90);
    local_98 = this_01;
    std::vector<AST*,std::allocator<AST*>>::emplace_back<AST*>
              ((vector<AST*,std::allocator<AST*>> *)__return_storage_ptr__,&local_98);
    __gnu_cxx::__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
    operator++(&__end1);
  }
  local_39 = 1;
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::~vector
            ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AST *> AST::findNonRecursive(std::string varName) {
    std::vector<ASTree *> trees1;
    std::vector<AST *> trees2;
    ast->findNonRecursive(varName, trees1);
    for (auto tree: trees1) {
        trees2.emplace_back(new AST(tree));
    }
    return trees2;
}